

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_>::
~vector(vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_> *this
       )

{
  vector<pbrt::Bounds2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Bounds2<float>_>_> *in_RDI;
  Bounds2<float> *in_stack_ffffffffffffffe8;
  
  clear(in_RDI);
  pmr::polymorphic_allocator<pbrt::Bounds2<float>>::deallocate_object<pbrt::Bounds2<float>>
            (&in_RDI->alloc,in_stack_ffffffffffffffe8,0x69ef0c);
  return;
}

Assistant:

~vector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }